

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_0::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int osErrorNumber;
  NetworkAddressImpl *this_00;
  void *pvVar1;
  undefined4 in_register_00000084;
  undefined1 local_88 [32];
  Fault f;
  SyscallResult local_44;
  undefined1 auStack_40 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  SocketAddress *addr;
  NetworkAddress *destination_local;
  DatagramPortImpl *this_local;
  ArrayPtr<const_unsigned_char> buffer_local;
  
  this_00 = downcast<kj::(anonymous_namespace)::NetworkAddressImpl,kj::NetworkAddress>
                      ((NetworkAddress *)CONCAT44(in_register_00000084,__flags));
  NetworkAddressImpl::chooseOneAddress(this_00);
  f.exception = (Exception *)auStack_40;
  local_44 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<unsigned_char_const>,kj::NetworkAddress&)::__0>
                       ((anon_class_32_4_86f71d10 *)&f,true);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_44);
  if (pvVar1 != (void *)0x0) {
    if ((long)_auStack_40 < 0) {
      UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_88);
      Promise<void>::
      then<kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<unsigned_char_const>,kj::NetworkAddress&)::__1>
                ((Promise<void> *)this,(Type *)local_88);
      Promise<void>::~Promise((Promise<void> *)local_88);
    }
    else {
      Promise<unsigned_long>::Promise
                ((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)_auStack_40);
    }
    return (ssize_t)this;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_44);
  kj::_::Debug::Fault::Fault
            ((Fault *)(local_88 + 0x18),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x6eb,osErrorNumber,
             "n = sendto(fd, buffer.begin(), buffer.size(), 0, addr.getRaw(), addr.getRawSize())",""
            );
  kj::_::Debug::Fault::fatal((Fault *)(local_88 + 0x18));
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    ArrayPtr<const byte> buffer, NetworkAddress& destination) {
  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendto(fd, buffer.begin(), buffer.size(), 0, addr.getRaw(), addr.getRawSize()));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, buffer, &destination]() {
      return send(buffer, destination);
    });
  } else {
    // If less than the whole message was sent, then it got truncated, and there's nothing we can
    // do about it.
    return n;
  }
}